

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_range_core.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
boost::
copy_range<std::__cxx11::string,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,boost *this,
          iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *r)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  uVar1 = *(undefined8 *)this;
  uVar2 = *(undefined8 *)(this + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,uVar1,uVar2);
  return __return_storage_ptr__;
}

Assistant:

inline SeqT copy_range( const Range& r )
        {
            return SeqT( boost::begin( r ), boost::end( r ) );
        }